

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

char_class charclass(uchar c)

{
  undefined4 local_c;
  uchar c_local;
  
  if ((c < 0x41) || (0x5a < c)) {
    if ((c < 0x61) || (0x7a < c)) {
      if ((c < 0x30) || (0x39 < c)) {
        local_c = CCLASS_OTHER;
      }
      else {
        local_c = CCLASS_DIGIT;
      }
    }
    else {
      local_c = CCLASS_LOWER;
    }
  }
  else {
    local_c = CCLASS_UPPER;
  }
  return local_c;
}

Assistant:

static char_class charclass(unsigned char c)
{
  if(ISUPPER(c))
    return CCLASS_UPPER;
  if(ISLOWER(c))
    return CCLASS_LOWER;
  if(ISDIGIT(c))
    return CCLASS_DIGIT;
  return CCLASS_OTHER;
}